

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O3

int levelSelect(Windows *gameInterface,MapList *mapList,_Bool *playerProgress)

{
  WINDOW *pWVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  Map *pMVar5;
  
  pWVar1 = gameInterface->menu;
  wclear(pWVar1);
  wborder(pWVar1,0,0,0,0,0,0,0,0);
  iVar3 = wmove(pWVar1,3,0x15);
  if (iVar3 != -1) {
    waddnstr(pWVar1,"LEVEL SELECT",0xffffffff);
  }
  iVar3 = wmove(pWVar1,5,0x15);
  if (iVar3 != -1) {
    whline(pWVar1,_DAT_0010925c,0x25);
  }
  mvwprintw(pWVar1,7,0x15,"[0] %s",mapList);
  if (1 < mapList->count) {
    pMVar5 = mapList->level;
    lVar4 = 1;
    do {
      pMVar5 = pMVar5 + 1;
      mvwprintw(pWVar1,(int)lVar4 + 7,0x15,"[%c] %s",(int)lVar4 + 0x30,pMVar5);
      lVar4 = lVar4 + 1;
    } while (lVar4 < mapList->count);
  }
  iVar3 = wmove(pWVar1,0x14,0x15);
  if (iVar3 != -1) {
    waddnstr(pWVar1,"[b]ack",0xffffffff);
  }
  wrefresh(pWVar1);
  cVar2 = wgetch(pWVar1);
  iVar3 = -1;
  if (cVar2 != 'b') {
    iVar3 = cVar2 + -0x30;
  }
  return iVar3;
}

Assistant:

int levelSelect(struct Windows *gameInterface, struct MapList *mapList,
    bool *playerProgress) {
    WINDOW *menu = gameInterface->menu;
    struct Map *current;
    int select;
    int y = 3;

#ifndef _DEBUG
    bool unlocked[MAX_LEVELS];
    struct Map *current, *last;
#endif

    wclear(menu);
    box(menu, 0, 0);

    /* Print header information */
    mvwaddstr(menu, y, 21, "LEVEL SELECT");
    mvwhline(menu, y += 2, 21, ACS_HLINE, 37);
    y += 2;

    /* Always print first level */
    mvwprintw(menu, y, 21, "[0] %s", mapList->level[0].name);

#ifndef _DEBUG
    unlocked[0] = true;
#endif

    /* Print additional levels */
    for (int i = 1; i < mapList->count; i++) {
        current = &mapList->level[i];
#ifndef _DEBUG
        last = &mapList->level[i - 1];
        if (!current->hidden) {
            mvwprintw(menu, y + i, 21, "[%c] %s",
                last->beaten ? i + '0' : '-', current->name);
        } else if (current->hidden && last->beaten) {
            mvwprintw(menu, y + i, 21, "[%i] %s", i, current->name);
        } else y--;
#else
        mvwprintw(menu, y + i, 21, "[%c] %s", i + '0', current->name);
#endif

        /* Set unlocked state */
#ifndef _DEBUG
        unlocked[i] = current->beaten;
#endif
    }
    mvwaddstr(menu, MAX_ROWS - 4, 21, "[b]ack");
    wrefresh(menu);

    /* Get user input */
    do {
        select = (char) wgetch(menu);
        if (select == 'b') return -1;
        if (select - '0' < 0 || select > MAX_LEVELS) continue;
#ifndef _DEBUG
        } while (!unlocked[select - '0']);
#else
    }